

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O1

void __thiscall
FIX::HttpConnection::processResetSession
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  char *pcVar1;
  Parameters *this_00;
  pointer pcVar2;
  undefined *puVar3;
  int iVar4;
  string *psVar5;
  const_iterator cVar6;
  Session *this_01;
  A *pAVar7;
  long *plVar8;
  TAG *pTVar9;
  size_t sVar10;
  SessionNotFound *this_02;
  _func_int **pp_Var11;
  ostream *poVar12;
  bool bVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar14;
  string sessionQualifier;
  string targetCompID;
  string senderCompID;
  string beginString;
  string sessionUrl;
  CENTER center;
  HttpMessage copy;
  SessionID sessionID;
  A a;
  H2 h2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  stringstream *local_808;
  long *local_800;
  long local_7f8;
  long local_7f0 [2];
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  stringstream *local_740;
  string local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  undefined1 local_6f8 [432];
  ostream *local_548;
  HttpMessage local_540;
  SessionID local_4f0;
  undefined1 local_3a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_388 [26];
  TAG local_1e8;
  
  local_808 = b;
  local_740 = h;
  HttpMessage::HttpMessage(&local_540,request);
  pcVar1 = local_6f8 + 0x10;
  local_6f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"BeginString","");
  psVar5 = HttpMessage::getParameter(request,(string *)local_6f8);
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_760,pcVar2,pcVar2 + psVar5->_M_string_length);
  if ((char *)local_6f8._0_8_ != pcVar1) {
    operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
  }
  local_6f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"SenderCompID","");
  psVar5 = HttpMessage::getParameter(request,(string *)local_6f8);
  local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_780,pcVar2,pcVar2 + psVar5->_M_string_length);
  if ((char *)local_6f8._0_8_ != pcVar1) {
    operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
  }
  local_6f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"TargetCompID","");
  psVar5 = HttpMessage::getParameter(request,(string *)local_6f8);
  local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7a0,pcVar2,pcVar2 + psVar5->_M_string_length);
  if ((char *)local_6f8._0_8_ != pcVar1) {
    operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
  }
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  local_7c0._M_string_length = 0;
  local_7c0.field_2._M_local_buf[0] = '\0';
  local_6f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"SessionQualifier","");
  this_00 = &local_540.m_parameters;
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_6f8);
  if ((char *)local_6f8._0_8_ != pcVar1) {
    operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
  }
  if ((_Rb_tree_header *)cVar6._M_node != &local_540.m_parameters._M_t._M_impl.super__Rb_tree_header
     ) {
    local_6f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"SessionQualifier","");
    HttpMessage::getParameter(&local_540,(string *)local_6f8);
    std::__cxx11::string::_M_assign((string *)&local_7c0);
    if ((char *)local_6f8._0_8_ != pcVar1) {
      operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
    }
  }
  SessionID::SessionID(&local_4f0,&local_760,&local_780,&local_7a0,&local_7c0);
  this_01 = Session::lookupSession(&local_4f0);
  if (this_01 == (Session *)0x0) {
    this_02 = (SessionNotFound *)__cxa_allocate_exception(0x50);
    local_6f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"");
    SessionNotFound::SessionNotFound(this_02,(string *)local_6f8);
    __cxa_throw(this_02,&SessionNotFound::typeinfo,FIX::Exception::~Exception);
  }
  HttpMessage::getParameterString_abi_cxx11_((string *)local_6f8,request);
  std::operator+(&local_718,"/session",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f8);
  if ((char *)local_6f8._0_8_ != pcVar1) {
    operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
  }
  local_6f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"confirm","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_6f8);
  if ((_Rb_tree_header *)cVar6._M_node == &local_540.m_parameters._M_t._M_impl.super__Rb_tree_header
     ) {
    bVar13 = false;
  }
  else {
    local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"confirm","");
    psVar5 = HttpMessage::getParameter(&local_540,&local_738);
    iVar4 = std::__cxx11::string::compare((char *)psVar5);
    bVar13 = iVar4 != 0;
  }
  if (((_Rb_tree_header *)cVar6._M_node !=
       &local_540.m_parameters._M_t._M_impl.super__Rb_tree_header) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2)) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_6f8._0_8_ != pcVar1) {
    operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
  }
  if (bVar13) {
    Session::reset(this_01);
    local_6f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"confirm","");
    pVar14 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::equal_range(&this_00->_M_t,(key_type *)local_6f8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
    if ((char *)local_6f8._0_8_ != pcVar1) {
      operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
    }
    if (bVar13) {
      poVar12 = (ostream *)(local_740 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"<META http-equiv=\'refresh\' content=2;URL=\'",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/session",8);
      HttpMessage::getParameterString_abi_cxx11_((string *)local_6f8,&local_540);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(char *)local_6f8._0_8_,local_6f8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'>",2);
      if ((char *)local_6f8._0_8_ != pcVar1) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      poVar12 = (ostream *)(local_808 + 0x10);
      HTML::CENTER::CENTER((CENTER *)local_6f8,poVar12);
      std::__ostream_insert<char,std::char_traits<char>>(local_548,">",1);
      HTML::H2::H2((H2 *)&local_1e8,poVar12);
      std::__ostream_insert<char,std::char_traits<char>>(local_1e8.m_stream,">",1);
      HTML::A::A((A *)local_3a0,poVar12);
      HttpMessage::getParameterString_abi_cxx11_(&local_7e0,&local_540);
      std::operator+(&local_828,"/session",&local_7e0);
      pAVar7 = HTML::A::href((A *)local_3a0,&local_828);
      local_800 = local_7f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_800,local_4f0.m_frozenString._M_dataplus._M_p,
                 local_4f0.m_frozenString._M_dataplus._M_p +
                 local_4f0.m_frozenString._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(pAVar7->super_TAG).field_0x38,(char *)local_800,local_7f8);
      std::__ostream_insert<char,std::char_traits<char>>((pAVar7->super_TAG).m_stream,">",1);
      if (local_800 != local_7f0) {
        operator_delete(local_800,local_7f0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_828._M_dataplus._M_p != &local_828.field_2) {
        operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
        operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
      }
      HTML::TAG::~TAG((TAG *)local_3a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," has been reset",0xf);
      HTML::TAG::~TAG(&local_1e8);
      goto LAB_0018235b;
    }
  }
  poVar12 = (ostream *)(local_808 + 0x10);
  HTML::CENTER::CENTER((CENTER *)local_6f8,poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(local_548,">",1);
  HTML::H2::H2((H2 *)&local_1e8,poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(local_1e8.m_stream,">",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"Are you sure you want to reset session ",0x27);
  HTML::A::A((A *)local_3a0,poVar12);
  HttpMessage::getParameterString_abi_cxx11_(&local_7e0,request);
  std::operator+(&local_828,&local_718,&local_7e0);
  pAVar7 = HTML::A::href((A *)local_3a0,&local_828);
  local_800 = local_7f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_800,local_4f0.m_frozenString._M_dataplus._M_p,
             local_4f0.m_frozenString._M_dataplus._M_p + local_4f0.m_frozenString._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pAVar7->super_TAG).field_0x38,(char *)local_800,local_7f8);
  std::__ostream_insert<char,std::char_traits<char>>((pAVar7->super_TAG).m_stream,">",1);
  if (local_800 != local_7f0) {
    operator_delete(local_800,local_7f0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
    operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG((TAG *)local_3a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"?",1);
  HTML::TAG::~TAG(&local_1e8);
  HTML::TAG::~TAG((TAG *)local_6f8);
  HTML::CENTER::CENTER((CENTER *)local_6f8,poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(local_548,">",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"[",1);
  HTML::A::A((A *)&local_1e8,poVar12);
  HttpMessage::toString_abi_cxx11_(&local_828,request);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_828);
  pp_Var11 = (_func_int **)(plVar8 + 2);
  if ((_func_int **)*plVar8 == pp_Var11) {
    local_3a0._16_8_ = *pp_Var11;
    aaStack_388[0]._0_8_ = plVar8[3];
    local_3a0._0_8_ = local_3a0 + 0x10;
  }
  else {
    local_3a0._16_8_ = *pp_Var11;
    local_3a0._0_8_ = (_func_int **)*plVar8;
  }
  local_3a0._8_8_ = plVar8[1];
  *plVar8 = (long)pp_Var11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  pTVar9 = &HTML::A::href((A *)&local_1e8,(string *)local_3a0)->super_TAG;
  HTML::TAG::text<char[19]>(pTVar9,(char (*) [19])"YES, reset session");
  if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
    operator_delete((void *)local_3a0._0_8_,(ulong)(local_3a0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG(&local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
  puVar3 = HTML::NBSP;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
  }
  else {
    sVar10 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,puVar3,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"[",1);
  HTML::A::A((A *)&local_1e8,poVar12);
  pTVar9 = &HTML::A::href((A *)&local_1e8,&local_718)->super_TAG;
  HTML::TAG::text<char[25]>(pTVar9,(char (*) [25])"NO, do not reset session");
  HTML::TAG::~TAG(&local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
LAB_0018235b:
  HTML::TAG::~TAG((TAG *)local_6f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0.m_frozenString._M_dataplus._M_p != &local_4f0.m_frozenString.field_2) {
    operator_delete(local_4f0.m_frozenString._M_dataplus._M_p,
                    local_4f0.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0.m_sessionQualifier._M_dataplus._M_p != &local_4f0.m_sessionQualifier.field_2) {
    operator_delete(local_4f0.m_sessionQualifier._M_dataplus._M_p,
                    local_4f0.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  FieldBase::~FieldBase((FieldBase *)&local_4f0.m_targetCompID);
  FieldBase::~FieldBase((FieldBase *)&local_4f0.m_senderCompID);
  FieldBase::~FieldBase((FieldBase *)&local_4f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    operator_delete(local_7c0._M_dataplus._M_p,
                    CONCAT71(local_7c0.field_2._M_allocated_capacity._1_7_,
                             local_7c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._M_dataplus._M_p != &local_780.field_2) {
    operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&this_00->_M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.m_root._M_dataplus._M_p != &local_540.m_root.field_2) {
    operator_delete(local_540.m_root._M_dataplus._M_p,
                    local_540.m_root.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void HttpConnection::processResetSession(const HttpMessage &request, std::stringstream &h, std::stringstream &b) {
  try {
    HttpMessage copy = request;
    std::string beginString = request.getParameter("BeginString");
    std::string senderCompID = request.getParameter("SenderCompID");
    std::string targetCompID = request.getParameter("TargetCompID");
    std::string sessionQualifier;
    if (copy.hasParameter("SessionQualifier")) {
      sessionQualifier = copy.getParameter("SessionQualifier");
    }

    SessionID sessionID(beginString, senderCompID, targetCompID, sessionQualifier);
    Session *pSession = Session::lookupSession(sessionID);
    if (pSession == 0) {
      throw SessionNotFound();
    }

    std::string sessionUrl = "/session" + request.getParameterString();

    bool confirm = false;
    if (copy.hasParameter("confirm") && copy.getParameter("confirm") != "0") {
      confirm = true;
      pSession->reset();
      copy.removeParameter("confirm");
    }

    if (confirm) {
      h << "<META http-equiv='refresh' content=2;URL='" << "/session" << copy.getParameterString() << "'>";
      CENTER center(b);
      center.text();
      H2 h2(b);
      h2.text();
      {
        A a(b);
        a.href("/session" + copy.getParameterString()).text(sessionID.toString());
      }
      b << " has been reset";
    } else {
      {
        CENTER center(b);
        center.text();
        H2 h2(b);
        h2.text();
        b << "Are you sure you want to reset session ";
        {
          A a(b);
          a.href(sessionUrl + request.getParameterString()).text(sessionID.toString());
        }
        b << "?";
      }
      {
        CENTER center(b);
        center.text();
        b << "[";
        {
          A a(b);
          a.href(request.toString() + "&confirm=1").text("YES, reset session");
        }
        b << "]" << NBSP << "[";
        {
          A a(b);
          a.href(sessionUrl).text("NO, do not reset session");
        }
        b << "]";
      }
    }
  } catch (std::exception &e) {
    b << e.what();
  }
}